

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtered_re2_test.cc
# Opt level: O1

void re2::FilteredRE2TestMatchEmptyPattern(void)

{
  FilteredRE2 *this;
  int iVar1;
  long lVar2;
  string text;
  vector<int,_std::allocator<int>_> atom_ids;
  FilterTestVars v;
  char *local_268;
  int local_260;
  char local_258 [16];
  vector<int,_std::allocator<int>_> local_248;
  FilterTestVars local_228;
  undefined1 local_198 [16];
  char *local_188 [46];
  
  FLAGS_filtered_re2_min_atom_len = 3;
  this = &local_228.f;
  local_228.matches.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_228.matches.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_228.atom_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.atom_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228.atoms.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228.atom_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.atoms.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.atoms.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.matches.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_228.opts.encoding_ = EncodingUTF8;
  local_228.opts.posix_syntax_ = false;
  local_228.opts.longest_match_ = false;
  local_228.opts.log_errors_ = true;
  local_228.opts.max_mem_ = 0x800000;
  local_228.opts.literal_ = false;
  local_228.opts.never_nl_ = false;
  local_228.opts.dot_nl_ = false;
  local_228.opts.never_capture_ = false;
  local_228.opts.case_sensitive_ = true;
  local_228.opts.perl_classes_ = false;
  local_228.opts.word_boundary_ = false;
  local_228.opts.one_line_ = false;
  FilteredRE2::FilteredRE2(this);
  std::__cxx11::string::string((string *)local_198,atom_tests,(allocator *)&local_268);
  iVar1 = std::__cxx11::string::compare(local_198);
  if ((char **)local_198._0_8_ != local_188) {
    operator_delete((void *)local_198._0_8_);
  }
  if (iVar1 != 0) {
    LogMessage::LogMessage
              ((LogMessage *)local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/filtered_re2_test.cc"
               ,0xd6,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_198 + 8),
               "Check failed: (\"CheckEmptyPattern\") == (string(t->testname))",0x3c);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_198);
  }
  lVar2 = 0;
  do {
    if ((&DAT_001592c8)[lVar2] == 0) goto LAB_0011abfd;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x14);
  lVar2 = 0x14;
LAB_0011abfd:
  AddRegexpsAndCompile((char **)&DAT_001592c8,(int)lVar2,&local_228);
  local_268 = local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"0123","");
  local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_198._0_8_ = local_268;
  local_198._8_4_ = local_260;
  iVar1 = FilteredRE2::FirstMatch(this,(StringPiece *)local_198,&local_248);
  if (iVar1 != 0) {
    LogMessage::LogMessage
              ((LogMessage *)local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/filtered_re2_test.cc"
               ,0xdf,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_198 + 8),"Check failed: (0) == (v.f.FirstMatch(text, atom_ids))",
               0x35);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_198);
  }
  if (local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_268 != local_258) {
    operator_delete(local_268);
  }
  FilteredRE2::~FilteredRE2(this);
  if (local_228.matches.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.matches.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_228.atom_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.atom_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228.atoms);
  return;
}

Assistant:

TEST(FilteredRE2Test, MatchEmptyPattern) {
  FLAGS_filtered_re2_min_atom_len = 3;

  FilterTestVars v;
  AtomTest* t = &atom_tests[0];
  // We are using the regexps used in one of the atom tests
  // for this test. Adding the EXPECT here to make sure
  // the index we use for the test is for the correct test.
  EXPECT_EQ("CheckEmptyPattern", string(t->testname));
  int nregexp;
  for (nregexp = 0; nregexp < arraysize(t->regexps); nregexp++)
    if (t->regexps[nregexp] == NULL)
      break;
  AddRegexpsAndCompile(t->regexps, nregexp, &v);
  string text = "0123";
  vector<int> atom_ids;
  vector<int> matching_regexps;
  EXPECT_EQ(0, v.f.FirstMatch(text, atom_ids));
}